

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.h
# Opt level: O0

DecimalFormatProperties * __thiscall
icu_63::number::impl::DecimalFormatProperties::operator=
          (DecimalFormatProperties *this,DecimalFormatProperties *param_1)

{
  bool bVar1;
  undefined2 uVar2;
  UNumberFormatAttributeValue UVar3;
  DecimalFormatProperties *param_1_local;
  DecimalFormatProperties *this_local;
  
  NullableValue<UNumberCompactStyle>::operator=(&this->compactStyle,&param_1->compactStyle);
  NullableValue<icu_63::CurrencyUnit>::operator=(&this->currency,&param_1->currency);
  CurrencyPluralInfoWrapper::operator=(&this->currencyPluralInfo,&param_1->currencyPluralInfo);
  NullableValue<UCurrencyUsage>::operator=(&this->currencyUsage,&param_1->currencyUsage);
  memcpy(&this->decimalPatternMatchRequired,&param_1->decimalPatternMatchRequired,0x3c);
  UnicodeString::operator=(&this->negativePrefix,&param_1->negativePrefix);
  UnicodeString::operator=(&this->negativePrefixPattern,&param_1->negativePrefixPattern);
  UnicodeString::operator=(&this->negativeSuffix,&param_1->negativeSuffix);
  UnicodeString::operator=(&this->negativeSuffixPattern,&param_1->negativeSuffixPattern);
  NullableValue<UNumberFormatPadPosition>::operator=(&this->padPosition,&param_1->padPosition);
  UnicodeString::operator=(&this->padString,&param_1->padString);
  bVar1 = param_1->parseIntegerOnly;
  this->parseCaseSensitive = param_1->parseCaseSensitive;
  this->parseIntegerOnly = bVar1;
  NullableValue<icu_63::number::impl::ParseMode>::operator=(&this->parseMode,&param_1->parseMode);
  bVar1 = param_1->parseToBigDecimal;
  uVar2 = *(undefined2 *)&param_1->field_0x1d6;
  UVar3 = param_1->parseAllInput;
  this->parseNoExponent = param_1->parseNoExponent;
  this->parseToBigDecimal = bVar1;
  *(undefined2 *)&this->field_0x1d6 = uVar2;
  this->parseAllInput = UVar3;
  UnicodeString::operator=(&this->positivePrefix,&param_1->positivePrefix);
  UnicodeString::operator=(&this->positivePrefixPattern,&param_1->positivePrefixPattern);
  UnicodeString::operator=(&this->positiveSuffix,&param_1->positiveSuffix);
  UnicodeString::operator=(&this->positiveSuffixPattern,&param_1->positiveSuffixPattern);
  this->roundingIncrement = param_1->roundingIncrement;
  NullableValue<UNumberFormatRoundingMode>::operator=(&this->roundingMode,&param_1->roundingMode);
  this->secondaryGroupingSize = param_1->secondaryGroupingSize;
  this->signAlwaysShown = param_1->signAlwaysShown;
  return this;
}

Assistant:

struct U_I18N_API DecimalFormatProperties : public UMemory {

  public:
    NullableValue<UNumberCompactStyle> compactStyle;
    NullableValue<CurrencyUnit> currency;
    CurrencyPluralInfoWrapper currencyPluralInfo;
    NullableValue<UCurrencyUsage> currencyUsage;
    bool decimalPatternMatchRequired;
    bool decimalSeparatorAlwaysShown;
    bool exponentSignAlwaysShown;
    bool formatFailIfMoreThanMaxDigits; // ICU4C-only
    int32_t formatWidth;
    int32_t groupingSize;
    bool groupingUsed;
    int32_t magnitudeMultiplier; // internal field like multiplierScale but separate to avoid conflict
    int32_t maximumFractionDigits;
    int32_t maximumIntegerDigits;
    int32_t maximumSignificantDigits;
    int32_t minimumExponentDigits;
    int32_t minimumFractionDigits;
    int32_t minimumGroupingDigits;
    int32_t minimumIntegerDigits;
    int32_t minimumSignificantDigits;
    int32_t multiplier;
    int32_t multiplierScale; // ICU4C-only
    UnicodeString negativePrefix;
    UnicodeString negativePrefixPattern;
    UnicodeString negativeSuffix;
    UnicodeString negativeSuffixPattern;
    NullableValue<PadPosition> padPosition;
    UnicodeString padString;
    bool parseCaseSensitive;
    bool parseIntegerOnly;
    NullableValue<ParseMode> parseMode;
    bool parseNoExponent;
    bool parseToBigDecimal; // TODO: Not needed in ICU4C?
    UNumberFormatAttributeValue parseAllInput; // ICU4C-only
    //PluralRules pluralRules;
    UnicodeString positivePrefix;
    UnicodeString positivePrefixPattern;
    UnicodeString positiveSuffix;
    UnicodeString positiveSuffixPattern;
    double roundingIncrement;
    NullableValue<RoundingMode> roundingMode;
    int32_t secondaryGroupingSize;
    bool signAlwaysShown;

    DecimalFormatProperties();

    inline bool operator==(const DecimalFormatProperties& other) const {
        return _equals(other, false);
    }

    void clear();

    /**
     * Checks for equality to the default DecimalFormatProperties, but ignores the prescribed set of
     * options for fast-path formatting.
     */
    bool equalsDefaultExceptFastFormat() const;

  private:
    bool _equals(const DecimalFormatProperties& other, bool ignoreForFastFormat) const;
}